

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPRequest.cpp
# Opt level: O2

void __thiscall HTTPRequest::HTTPRequest(HTTPRequest *this,char *request,int requestSize)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  string *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar3;
  long lVar4;
  istream *piVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  ulong uVar8;
  ulong uVar9;
  allocator<char> local_409;
  string *local_408;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f8;
  string *local_3f0;
  int local_3e4;
  string reqStr;
  string header;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  key_type local_380;
  string firstLine;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [23];
  stringstream firstLineSS;
  ostream local_1a8 [376];
  
  (this->method)._M_dataplus._M_p = (pointer)&(this->method).field_2;
  (this->method)._M_string_length = 0;
  uVar9 = 0;
  (this->method).field_2._M_local_buf[0] = '\0';
  local_3f8 = &this->filepath;
  (this->filepath)._M_dataplus._M_p = (pointer)&(this->filepath).field_2;
  (this->filepath)._M_string_length = 0;
  (this->filepath).field_2._M_local_buf[0] = '\0';
  local_3f0 = (string *)&this->query;
  (this->query)._M_dataplus._M_p = (pointer)&(this->query).field_2;
  (this->query)._M_string_length = 0;
  (this->query).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->headers)._M_t._M_impl.super__Rb_tree_header;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_400 = &this->headers;
  local_408 = (string *)&this->body;
  (this->body)._M_dataplus._M_p = (pointer)&(this->body).field_2;
  (this->body)._M_string_length = 0;
  (this->body).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&firstLineSS);
  uVar8 = 0;
  local_3e4 = requestSize;
  if (0 < requestSize) {
    uVar8 = (ulong)(uint)requestSize;
  }
  do {
    if (uVar8 == uVar9) {
LAB_0010570f:
      std::__cxx11::stringbuf::str();
      lVar4 = std::__cxx11::string::find((char *)&firstLine,0x10733c);
      if (lVar4 == -1) {
        this->valid = false;
      }
      else {
        words.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        _ss = (pointer)local_330;
        words.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        words.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_330[0]._M_local_buf[0] = '\0';
        while( true ) {
          piVar5 = std::operator>>((istream *)&firstLineSS,(string *)&ss);
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&words,(value_type *)&ss);
        }
        std::__cxx11::string::~string((string *)&ss);
        __lhs = local_3f8;
        std::__cxx11::string::_M_assign((string *)this);
        std::__cxx11::string::_M_assign((string *)__lhs);
        lVar4 = std::__cxx11::string::find((char *)__lhs,0x107345);
        if (lVar4 == -1) {
          std::__cxx11::string::assign((char *)local_3f0);
        }
        else {
          std::__cxx11::string::substr((ulong)&ss,(ulong)__lhs);
          std::__cxx11::string::operator=(local_3f0,(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::substr((ulong)&ss,(ulong)__lhs);
          std::__cxx11::string::operator=((string *)__lhs,(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
        }
        std::__cxx11::string::substr((ulong)&ss,(ulong)__lhs);
        std::__cxx11::string::operator=((string *)__lhs,(string *)&ss);
        std::__cxx11::string::~string((string *)&ss);
        bVar3 = std::operator==(__lhs,"");
        if (bVar3) {
          std::__cxx11::string::_M_assign((string *)__lhs);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        lVar4 = (long)local_3e4;
        for (; this_01 = local_400, (long)uVar8 < lVar4; uVar8 = uVar8 + 1) {
          std::operator<<((ostream *)local_330[0]._M_local_buf,request[uVar8]);
        }
        reqStr._M_dataplus._M_p = (pointer)&reqStr.field_2;
        reqStr._M_string_length = 0;
        reqStr.field_2._M_local_buf[0] = '\0';
        while( true ) {
          piVar5 = std::operator>>((istream *)&ss,(string *)&reqStr);
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
          if (reqStr._M_dataplus._M_p[reqStr._M_string_length - 1] == ':') {
            std::__cxx11::string::substr((ulong)&header,(ulong)&reqStr);
            std::operator>>((istream *)&ss,(string *)&reqStr);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](this_01,&header);
            std::__cxx11::string::_M_assign((string *)pmVar6);
            std::__cxx11::string::~string((string *)&header);
          }
        }
        std::__cxx11::string::~string((string *)&reqStr);
        this_00 = local_408;
        std::__cxx11::string::assign((char *)local_408);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&header,"Content-Length",(allocator<char> *)&local_380);
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&this_01->_M_t,&header);
        std::__cxx11::string::~string((string *)&header);
        if ((_Rb_tree_header *)iVar7._M_node != p_Var1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_380,"Content-Length",&local_409);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](this_01,&local_380);
          std::__cxx11::stoi(pmVar6,(size_t *)0x0,10);
          std::__cxx11::string::substr((ulong)&header,(ulong)&reqStr);
          std::__cxx11::string::operator=(this_00,(string *)&header);
          std::__cxx11::string::~string((string *)&header);
          std::__cxx11::string::~string((string *)&local_380);
        }
        this->valid = true;
        std::__cxx11::string::~string((string *)&reqStr);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&words);
      }
      std::__cxx11::string::~string((string *)&firstLine);
      std::__cxx11::stringstream::~stringstream((stringstream *)&firstLineSS);
      return;
    }
    cVar2 = request[uVar9];
    if ((cVar2 == '\0') || (cVar2 == '\n')) {
      uVar8 = uVar9 & 0xffffffff;
      goto LAB_0010570f;
    }
    std::operator<<(local_1a8,cVar2);
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

HTTPRequest::HTTPRequest(char* request, int requestSize)
{
    std::stringstream firstLineSS;
    int i = 0;
    for (i = 0; i < requestSize; i++)
    {
        if (request[i] == '\n' || request[i] == 0) break;
        firstLineSS << request[i];
    }
    std::string firstLine = firstLineSS.str();
    if (firstLine.find("HTTP/1.1") == std::string::npos)
    {
        valid = false;
        return;
    }
    std::vector<std::string> words;
    for (std::string word; firstLineSS >> word;)
        words.push_back(word);
    
    method = words[0];
    filepath = words[1];

    auto pos = filepath.find("?");
    if (pos != std::string::npos)
    {
        query = filepath.substr(pos + 1);
        filepath = filepath.substr(0, pos);
    }
    else query = "";
    filepath = filepath.substr(1);
    if (filepath == "") filepath = ENTRYPOINT;
    
    std::stringstream ss;
    for (; i < requestSize; i++) ss << request[i];
    for (std::string word; ss >> word;)
    {
        if (word.back() != ':') continue;
        std::string header = word.substr(0, word.size() - 1);
        ss >> word;
        headers[header] = word;
    }
    body = "";
    std::string reqStr = ss.str();
    if (headers.find("Content-Length") != headers.end())
        body = reqStr.substr(reqStr.size() - stoi(headers["Content-Length"]));

    valid = true;
}